

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O0

int EVP_PKEY_CTX_ctrl(EVP_PKEY_CTX *ctx,int keytype,int optype,int cmd,int p1,void *p2)

{
  void *p2_local;
  int p1_local;
  int cmd_local;
  int optype_local;
  int keytype_local;
  EVP_PKEY_CTX *ctx_local;
  
  if (((ctx == (EVP_PKEY_CTX *)0x0) || (*(long *)ctx == 0)) || (*(long *)(*(long *)ctx + 0x70) == 0)
     ) {
    ERR_put_error(6,0,0x65,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                  ,0x94);
    ctx_local._4_4_ = 0;
  }
  else if ((keytype == -1) || (**(int **)ctx == keytype)) {
    if (*(int *)(ctx + 0x20) == 0) {
      ERR_put_error(6,0,0x7b,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                    ,0x9d);
      ctx_local._4_4_ = 0;
    }
    else if ((optype == -1) || ((*(uint *)(ctx + 0x20) & optype) != 0)) {
      ctx_local._4_4_ = (**(code **)(*(long *)ctx + 0x70))(ctx,cmd,p1,p2);
    }
    else {
      ERR_put_error(6,0,0x72,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                    ,0xa2);
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ERR_put_error(6,0,0x7d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                  ,0x98);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int EVP_PKEY_CTX_ctrl(EVP_PKEY_CTX *ctx, int keytype, int optype, int cmd,
                      int p1, void *p2) {
  if (!ctx || !ctx->pmeth || !ctx->pmeth->ctrl) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_COMMAND_NOT_SUPPORTED);
    return 0;
  }
  if (keytype != -1 && ctx->pmeth->pkey_id != keytype) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_OPERATION_NOT_SUPPORTED_FOR_THIS_KEYTYPE);
    return 0;
  }

  if (ctx->operation == EVP_PKEY_OP_UNDEFINED) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_NO_OPERATION_SET);
    return 0;
  }

  if (optype != -1 && !(ctx->operation & optype)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_OPERATION);
    return 0;
  }

  return ctx->pmeth->ctrl(ctx, cmd, p1, p2);
}